

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_33(QPDF *pdf,char *arg2)

{
  FILE *__s;
  void *__ptr;
  size_t __size;
  FILE *f;
  shared_ptr<Buffer> b;
  QPDFWriter local_60 [8];
  QPDFWriter w;
  Pl_Buffer local_50 [8];
  Pl_Buffer p;
  char *arg2_local;
  QPDF *pdf_local;
  
  Pl_Buffer::Pl_Buffer(local_50,"buffer",(Pipeline *)0x0);
  QPDFWriter::QPDFWriter(local_60,pdf);
  QPDFWriter::setStaticID(SUB81(local_60,0));
  QPDFWriter::setOutputPipeline((Pipeline *)local_60);
  QPDFWriter::write();
  Pl_Buffer::getBufferSharedPointer();
  __s = (FILE *)QUtil::safe_fopen("a.pdf","wb");
  std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&f);
  __ptr = (void *)Buffer::getBuffer();
  std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&f);
  __size = Buffer::getSize();
  fwrite(__ptr,__size,1,__s);
  fclose(__s);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&f);
  QPDFWriter::~QPDFWriter(local_60);
  Pl_Buffer::~Pl_Buffer(local_50);
  return;
}

Assistant:

static void
test_33(QPDF& pdf, char const* arg2)
{
    // Test writing to a custom pipeline
    Pl_Buffer p("buffer");
    QPDFWriter w(pdf);
    w.setStaticID(true);
    w.setOutputPipeline(&p);
    w.write();
    auto b = p.getBufferSharedPointer();
    FILE* f = QUtil::safe_fopen("a.pdf", "wb");
    fwrite(b->getBuffer(), b->getSize(), 1, f);
    fclose(f);
}